

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebuggerAdapter.cxx
# Opt level: O3

void __thiscall cmDebugger::cmDebuggerAdapter::ReportExitCode(cmDebuggerAdapter *this,int exitCode)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  Session *pSVar1;
  TypeInfo *pTVar2;
  ThreadEvent threadEvent;
  long local_a8;
  undefined1 *local_a0;
  undefined8 local_98;
  undefined1 local_90;
  undefined7 uStack_8f;
  int64_t local_80;
  any local_78;
  undefined1 local_40;
  vector<dap::any,_std::allocator<dap::any>_> local_38;
  
  cmDebuggerThreadManager::EndThread
            ((this->ThreadManager)._M_t.
             super___uniq_ptr_impl<cmDebugger::cmDebuggerThreadManager,_std::default_delete<cmDebugger::cmDebuggerThreadManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmDebugger::cmDebuggerThreadManager_*,_std::default_delete<cmDebugger::cmDebuggerThreadManager>_>
             .super__Head_base<0UL,_cmDebugger::cmDebuggerThreadManager_*,_false>._M_head_impl,
             &this->DefaultThread);
  local_98 = 0;
  local_90 = 0;
  local_80 = 0;
  local_a0 = &local_90;
  std::__cxx11::string::_M_replace((ulong)&local_a0,0,(char *)0x0,0x7c385d);
  local_80 = ((this->DefaultThread).
              super___shared_ptr<cmDebugger::cmDebuggerThread,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             Id;
  this_00 = (this->DefaultThread).
            super___shared_ptr<cmDebugger::cmDebuggerThread,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi;
  (this->DefaultThread).super___shared_ptr<cmDebugger::cmDebuggerThread,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->DefaultThread).super___shared_ptr<cmDebugger::cmDebuggerThread,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  local_a8 = (long)exitCode;
  local_38.super__Vector_base<dap::any,_std::allocator<dap::any>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_38.super__Vector_base<dap::any,_std::allocator<dap::any>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_38.super__Vector_base<dap::any,_std::allocator<dap::any>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_78.value = (void *)0x0;
  local_78.type = (TypeInfo *)0x0;
  local_78.heap = (void *)0x0;
  dap::any::operator=(&local_78,&local_38);
  std::vector<dap::any,_std::allocator<dap::any>_>::~vector(&local_38);
  local_40 = 0;
  if (((this->SessionActive)._M_base._M_i & 1U) != 0) {
    pSVar1 = (this->Session)._M_t.
             super___uniq_ptr_impl<dap::Session,_std::default_delete<dap::Session>_>._M_t.
             super__Tuple_impl<0UL,_dap::Session_*,_std::default_delete<dap::Session>_>.
             super__Head_base<0UL,_dap::Session_*,_false>._M_head_impl;
    pTVar2 = dap::TypeOf<dap::ThreadEvent>::type();
    (*pSVar1->_vptr_Session[0xb])(pSVar1,pTVar2,&local_a0);
    pSVar1 = (this->Session)._M_t.
             super___uniq_ptr_impl<dap::Session,_std::default_delete<dap::Session>_>._M_t.
             super__Tuple_impl<0UL,_dap::Session_*,_std::default_delete<dap::Session>_>.
             super__Head_base<0UL,_dap::Session_*,_false>._M_head_impl;
    pTVar2 = dap::TypeOf<dap::ExitedEvent>::type();
    (*pSVar1->_vptr_Session[0xb])(pSVar1,pTVar2,&local_a8);
    pSVar1 = (this->Session)._M_t.
             super___uniq_ptr_impl<dap::Session,_std::default_delete<dap::Session>_>._M_t.
             super__Tuple_impl<0UL,_dap::Session_*,_std::default_delete<dap::Session>_>.
             super__Head_base<0UL,_dap::Session_*,_false>._M_head_impl;
    pTVar2 = dap::TypeOf<dap::TerminatedEvent>::type();
    (*pSVar1->_vptr_Session[0xb])(pSVar1,pTVar2,&local_78);
  }
  SyncEvent::Wait((this->DisconnectEvent)._M_t.
                  super___uniq_ptr_impl<cmDebugger::SyncEvent,_std::default_delete<cmDebugger::SyncEvent>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_cmDebugger::SyncEvent_*,_std::default_delete<cmDebugger::SyncEvent>_>
                  .super__Head_base<0UL,_cmDebugger::SyncEvent_*,_false>._M_head_impl);
  if (local_78.value != (void *)0x0) {
    (*(local_78.type)->_vptr_TypeInfo[7])();
    if (local_78.value == (void *)0x0) {
      __assert_fail("value != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmcppdap/include/dap/any.h"
                    ,0xc3,"void dap::any::free()");
    }
    if (local_78.heap != (void *)0x0) {
      operator_delete__(local_78.heap);
    }
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,CONCAT71(uStack_8f,local_90) + 1);
  }
  return;
}

Assistant:

void cmDebuggerAdapter::ReportExitCode(int exitCode)
{
  ThreadManager->EndThread(DefaultThread);
  dap::ThreadEvent threadEvent;
  threadEvent.reason = "exited";
  threadEvent.threadId = DefaultThread->GetId();
  DefaultThread.reset();

  dap::ExitedEvent exitEvent;
  exitEvent.exitCode = exitCode;

  dap::TerminatedEvent terminatedEvent;

  if (SessionActive.load()) {
    Session->send(threadEvent);
    Session->send(exitEvent);
    Session->send(terminatedEvent);
  }

  // Wait until disconnected or error.
  DisconnectEvent->Wait();
}